

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O1

string * CLI::clean_name_string(string *name,string *keyChars)

{
  char *pcVar1;
  long lVar2;
  string local_38;
  
  lVar2 = ::std::__cxx11::string::find_first_of((char *)name,(ulong)(keyChars->_M_dataplus)._M_p,0);
  if ((lVar2 != -1) ||
     (((pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 == '[' &&
       (pcVar1[name->_M_string_length - 1] == ']')) ||
      (lVar2 = ::std::__cxx11::string::find_first_of((char *)name,0x1b59af,0), lVar2 != -1)))) {
    lVar2 = ::std::__cxx11::string::find((char)name,0x27);
    if ((lVar2 != -1) &&
       (lVar2 = ::std::__cxx11::string::find_first_of
                          ((char *)name,detail::escapedChars_abi_cxx11_,0), lVar2 != -1)) {
      detail::add_escaped_characters(&local_38,name);
      ::std::__cxx11::string::operator=((string *)name,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::string::insert((ulong)name,0,'\x01');
    ::std::__cxx11::string::push_back((char)name);
  }
  return name;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}